

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O2

int send_iovec(socket_t fd,iovec *iov,int cnt)

{
  ssize_t sVar1;
  
  sVar1 = writev(fd,(iovec *)iov,cnt);
  return (int)sVar1;
}

Assistant:

int send_iovec(socket_t fd, iovec *iov, int cnt)
{
#if defined(__linux__) || defined(__APPLE__)
    return ::writev(fd, iov, cnt);
#else
    unsigned long sendLen = 0;
    int ret = WSASend(fd, (WSABUF*)iov, cnt, &sendLen, 0, NULL, NULL);
    if (ret != 0)
    {
        return ret;
    }
    return sendLen;
#endif
}